

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<double>::ComputeEigenvalues
          (TPZTensor<double> *this,TPZDecomposed *eigensystem,bool compute_eigenvectors)

{
  undefined8 uVar1;
  double *pdVar2;
  TPZManVector<double,_3> *pTVar3;
  bool bVar4;
  uint uVar5;
  double *pdVar6;
  byte bVar7;
  uint *puVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double local_78;
  TPZManVector<double,_3> temp;
  
  dVar10 = Norm(this);
  dVar10 = dVar10 * 1e-12;
  bVar4 = IsZeroTensor(this,dVar10);
  if (bVar4) {
    eigensystem->fDistinctEigenvalues = 1;
    pdVar2 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
    *pdVar2 = 0.0;
    pdVar2[1] = 0.0;
    pdVar2[2] = 0.0;
    puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
    puVar8[0] = 3;
    puVar8[1] = 3;
    puVar8[2] = 3;
    if (compute_eigenvectors) {
      local_78 = 0.0;
      TPZManVector<double,_3>::TPZManVector(&temp,3,&local_78);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,&temp);
      TPZManVector<double,_3>::~TPZManVector(&temp);
      *(((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore)->
       super_TPZVec<double>).fStore = 1.0;
      local_78 = 0.0;
      TPZManVector<double,_3>::TPZManVector(&temp,3,&local_78);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                 &temp);
      TPZManVector<double,_3>::~TPZManVector(&temp);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[1].
      super_TPZVec<double>.fStore[1] = 1.0;
      local_78 = 0.0;
      TPZManVector<double,_3>::TPZManVector(&temp,3,&local_78);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
                 &temp);
      TPZManVector<double,_3>::~TPZManVector(&temp);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[2].
      super_TPZVec<double>.fStore[2] = 1.0;
    }
  }
  else {
    bVar4 = IsDiagonal(this,dVar10);
    if (bVar4) {
      pdVar2 = (this->fData).super_TPZVec<double>.fStore;
      dVar14 = *pdVar2;
      pdVar6 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      *pdVar6 = dVar14;
      dVar12 = pdVar2[3];
      pdVar6[1] = dVar12;
      dVar11 = pdVar2[5];
      pdVar6[2] = dVar11;
      if (compute_eigenvectors) {
        (*(eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>._vptr_TPZVec[4])
                  (&eigensystem->fEigenvectors,3);
        local_78 = 0.0;
        TPZManVector<double,_3>::TPZManVector(&temp,3,&local_78);
        TPZManVector<double,_3>::operator=
                  ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,&temp)
        ;
        TPZManVector<double,_3>::~TPZManVector(&temp);
        *(((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore)->
         super_TPZVec<double>).fStore = 1.0;
        local_78 = 0.0;
        TPZManVector<double,_3>::TPZManVector(&temp,3,&local_78);
        TPZManVector<double,_3>::operator=
                  ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                   &temp);
        TPZManVector<double,_3>::~TPZManVector(&temp);
        (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[1].
        super_TPZVec<double>.fStore[1] = 1.0;
        local_78 = 0.0;
        TPZManVector<double,_3>::TPZManVector(&temp,3,&local_78);
        TPZManVector<double,_3>::operator=
                  ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
                   &temp);
        TPZManVector<double,_3>::~TPZManVector(&temp);
        (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[2].
        super_TPZVec<double>.fStore[2] = 1.0;
        pdVar6 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
        dVar14 = *pdVar6;
        dVar12 = pdVar6[1];
        dVar11 = pdVar6[2];
      }
      dVar15 = ABS(dVar14 - dVar12);
      dVar16 = ABS(dVar12 - dVar11);
      if ((dVar10 < dVar15) || (dVar10 < dVar16)) {
        if ((dVar15 <= dVar10) || ((dVar16 <= dVar10 || (ABS(dVar14 - dVar11) <= dVar10)))) {
          uVar9 = (ulong)(dVar10 < dVar16);
          bVar4 = dVar10 < dVar15;
          eigensystem->fDistinctEigenvalues = 2;
          if (!bVar4) {
            uVar9 = 2;
          }
          puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
          puVar8[uVar9] = 1;
          puVar8[bVar4 && dVar10 >= dVar16] = 2;
          puVar8[bVar4 + 1] = 2;
        }
        else {
          eigensystem->fDistinctEigenvalues = 3;
          puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
          puVar8[0] = 1;
          puVar8[1] = 1;
          puVar8[2] = 1;
        }
        if (dVar14 < dVar12) {
          *pdVar6 = dVar12;
          pdVar6[1] = dVar14;
          *(ulong *)puVar8 =
               CONCAT44((int)*(undefined8 *)puVar8,(int)((ulong)*(undefined8 *)puVar8 >> 0x20));
          dVar12 = dVar14;
          if (compute_eigenvectors) {
            TPZManVector<double,_3>::TPZManVector
                      (&temp,(eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.
                             fStore);
            pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
            TPZManVector<double,_3>::operator=(pTVar3,pTVar3 + 1);
            TPZManVector<double,_3>::operator=
                      ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore +
                       1,&temp);
            TPZManVector<double,_3>::~TPZManVector(&temp);
            pdVar6 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
            dVar12 = pdVar6[1];
            dVar11 = pdVar6[2];
          }
        }
        if (dVar12 < dVar11) {
          pdVar6[1] = dVar11;
          pdVar6[2] = dVar12;
          puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
          uVar1 = *(undefined8 *)(puVar8 + 1);
          *(ulong *)(puVar8 + 1) = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
          dVar12 = dVar11;
          if (compute_eigenvectors) {
            TPZManVector<double,_3>::TPZManVector
                      (&temp,(eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.
                             fStore + 1);
            pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
            TPZManVector<double,_3>::operator=(pTVar3 + 1,pTVar3 + 2);
            TPZManVector<double,_3>::operator=
                      ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore +
                       2,&temp);
            TPZManVector<double,_3>::~TPZManVector(&temp);
            pdVar6 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
            dVar12 = pdVar6[1];
          }
        }
        dVar10 = *pdVar6;
        if (dVar12 <= dVar10) {
          return;
        }
        *pdVar6 = dVar12;
        pdVar6[1] = dVar10;
        puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        uVar1 = *(undefined8 *)puVar8;
        *(ulong *)puVar8 = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
        if (!compute_eigenvectors) {
          return;
        }
        TPZManVector<double,_3>::TPZManVector
                  (&temp,(eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore)
        ;
        pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
        TPZManVector<double,_3>::operator=(pTVar3,pTVar3 + 1);
        TPZManVector<double,_3>::operator=
                  ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                   &temp);
        TPZManVector<double,_3>::~TPZManVector(&temp);
        return;
      }
    }
    else {
      DirectEigenValues(this,eigensystem,compute_eigenvectors);
      pdVar2 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      auVar13._8_8_ = -(ulong)(ABS(pdVar2[1] - pdVar2[2]) <= dVar10);
      auVar13._0_8_ = -(ulong)(ABS(*pdVar2 - pdVar2[1]) <= dVar10);
      uVar5 = movmskpd((int)pdVar2,auVar13);
      if (uVar5 != 3) {
        bVar7 = (byte)uVar5;
        if (((bVar7 >> 1 | bVar7) & 1) != 0) {
          eigensystem->fDistinctEigenvalues = 2;
          puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
          puVar8[1] = 2;
          puVar8[(ulong)((byte)~bVar7 & 1) * 2] = 2;
          puVar8[(ulong)(uVar5 & 1) * 2] = 1;
          return;
        }
        eigensystem->fDistinctEigenvalues = 3;
        puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        puVar8[0] = 1;
        puVar8[1] = 1;
        puVar8[2] = 1;
        return;
      }
    }
    eigensystem->fDistinctEigenvalues = 1;
    puVar8 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
    puVar8[0] = 3;
    puVar8[1] = 3;
    puVar8[2] = 3;
  }
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvalues(TPZDecomposed &eigensystem, const bool compute_eigenvectors) const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZManVector<T, 3>, 3> &eigenvectors = eigensystem.fEigenvectors;

    T tol = Norm()*1.e-12;

    if (this->IsZeroTensor(tol)) {
        eigensystem.fDistinctEigenvalues = 1;
        eigenvalues[0] = eigenvalues[1] = eigenvalues[2] = 0.;
        eigensystem.fGeometricMultiplicity[0] = 3;
        eigensystem.fGeometricMultiplicity[1] = 3;
        eigensystem.fGeometricMultiplicity[2] = 3;
        if (compute_eigenvectors) {
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }
    } else if (this->IsDiagonal(tol)) {
        eigenvalues[0] = this->XX();
        eigenvalues[1] = this->YY();
        eigenvalues[2] = this->ZZ();

        if (compute_eigenvectors) {
            eigenvectors.resize(3);
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);

        if (ev0eqev1 && ev1eqev2) {
            //tres autovalores iguais
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
            return;
        } else if (ev0eqev1 || ev1eqev2 || AreEqual(eigenvalues[0], eigenvalues[2], tol)) {
            eigensystem.fDistinctEigenvalues = 2;
            int different = -1;
            int equals[2] = {-1, -1};
            if (ev0eqev1) {
                different = 2;
                equals[0] = 0;
                equals[1] = 1;
            } else if (ev1eqev2) {
                different = 0;
                equals[0] = 1;
                equals[1] = 2;
            } else {
                different = 1;
                equals[0] = 0;
                equals[1] = 2;
            }
            eigensystem.fGeometricMultiplicity[different] = 1;
            eigensystem.fGeometricMultiplicity[equals[0]] = 2;
            eigensystem.fGeometricMultiplicity[equals[1]] = 2;
        } else {
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }

        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
        if (eigenvalues[1] < eigenvalues[2]) {
            T eigenvalueTemp = eigenvalues[1];
            eigenvalues[1] = eigenvalues[2];
            eigenvalues[2] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[1], eigensystem.fGeometricMultiplicity[2]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[1];
                eigenvectors[1] = eigenvectors[2];
                eigenvectors[2] = temp;
            }
        }
        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
    } else {
        this->DirectEigenValues(eigensystem, compute_eigenvectors);

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);
        //tres autovalores iguais
        if (ev0eqev1 && ev1eqev2) {
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
        } else if (ev0eqev1 || ev1eqev2) {
            //dois autovalores iguais
            eigensystem.fDistinctEigenvalues = 2;

            int different = -1;
            int equals = -1;
            if (ev0eqev1) {
                different = 2;
                equals = 0;
            } else {
                different = 0;
                equals = 2;
            }
            eigensystem.fGeometricMultiplicity[1] = 2;
            eigensystem.fGeometricMultiplicity[equals] = 2;
            eigensystem.fGeometricMultiplicity[different] = 1;
        } else {
            //3 autovalores diferentes
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }
    }
}